

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

double __thiscall despot::Parser::LogNumObservations(Parser *this)

{
  pointer pNVar1;
  long lVar2;
  int i;
  ulong uVar3;
  double dVar4;
  __type _Var5;
  
  dVar4 = 0.0;
  lVar2 = 0x10;
  for (uVar3 = 0;
      pNVar1 = (this->obs_vars_).
               super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(this->obs_vars_).
                             super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1) / 0x78);
      uVar3 = uVar3 + 1) {
    _Var5 = std::log2<int>((int)((ulong)(*(long *)((long)&(pNVar1->super_Variable)._vptr_Variable +
                                                  lVar2) - *(long *)((long)pNVar1 + lVar2 + -8)) >>
                                5));
    dVar4 = dVar4 + _Var5;
    lVar2 = lVar2 + 0x78;
  }
  return dVar4;
}

Assistant:

double Parser::LogNumObservations() const {
	double log_num_obss = 0;

	for (int i = 0; i < obs_vars_.size(); i++) {
		log_num_obss += log2(obs_vars_[i].Size());
	}

	return log_num_obss;
}